

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::matrices_times_vectors(Omega_h *this,Reals *ms,Reals *vs,Int dim)

{
  void *extraout_RDX;
  Write<double> *this_00;
  Write<double> *this_01;
  Reals RVar1;
  Write<double> local_80;
  Write<double> local_70;
  Write<double> local_60;
  Write<double> local_50;
  Write<double> local_40;
  Write<double> local_30;
  
  if (dim == 1) {
    Write<double>::Write(&local_80,&ms->write_);
    this_01 = &local_50;
    Write<double>::Write(this_01,&vs->write_);
    this_00 = &local_80;
    matrices_times_vectors_dim<1>(this,(Reals *)this_00,(Reals *)this_01);
  }
  else if (dim == 2) {
    Write<double>::Write(&local_70,&ms->write_);
    this_01 = &local_40;
    Write<double>::Write(this_01,&vs->write_);
    this_00 = &local_70;
    matrices_times_vectors_dim<2>(this,(Reals *)this_00,(Reals *)this_01);
  }
  else {
    if (dim != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
           ,0x42);
    }
    Write<double>::Write(&local_60,&ms->write_);
    this_01 = &local_30;
    Write<double>::Write(this_01,&vs->write_);
    this_00 = &local_60;
    matrices_times_vectors_dim<3>(this,(Reals *)this_00,(Reals *)this_01);
  }
  Write<double>::~Write(this_01);
  Write<double>::~Write(this_00);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals matrices_times_vectors(Reals ms, Reals vs, Int dim) {
  if (dim == 3) return matrices_times_vectors_dim<3>(ms, vs);
  if (dim == 2) return matrices_times_vectors_dim<2>(ms, vs);
  if (dim == 1) return matrices_times_vectors_dim<1>(ms, vs);
  OMEGA_H_NORETURN(Reals());
}